

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O3

void getUnscaledInfeasibilities
               (HighsOptions *options,HighsScale *scale,SimplexBasis *basis,HighsSimplexInfo *info,
               HighsInfo *highs_info)

{
  HighsInt *pHVar1;
  double dVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar2 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar15 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
  iVar11 = scale->num_col;
  iVar10 = scale->num_row;
  if (iVar10 + iVar11 != 0 && SCARRY4(iVar10,iVar11) == iVar10 + iVar11 < 0) {
    lVar12 = 0;
    do {
      if ((basis->nonbasicFlag_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar12] != '\0') {
        dVar17 = (info->workLower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        dVar18 = (info->workUpper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        if ((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) {
          if (lVar12 < iVar11) {
            dVar16 = 1.0 / ((scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[lVar12] / scale->cost);
          }
          else {
            dVar16 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)lVar12 - iVar11] * scale->cost;
          }
          dVar16 = dVar16 * (info->workDual_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar12];
          bVar9 = highs_isInfinity(-dVar17);
          if (bVar9) {
            bVar9 = highs_isInfinity(dVar18);
            if (!bVar9) goto LAB_00362b45;
            dVar16 = ABS(dVar16);
          }
          else {
LAB_00362b45:
            dVar16 = dVar16 * (double)-(int)(basis->nonbasicMove_).
                                            super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar12];
          }
          if (0.0 < dVar16) {
            if (dVar15 <= dVar16) {
              pHVar1 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
              *pHVar1 = *pHVar1 + 1;
            }
            dVar17 = (highs_info->super_HighsInfoStruct).max_dual_infeasibility;
            uVar13 = SUB84(dVar17,0);
            uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
            if (dVar17 <= dVar16) {
              uVar13 = SUB84(dVar16,0);
              uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
            }
            (highs_info->super_HighsInfoStruct).max_dual_infeasibility =
                 (double)CONCAT44(uVar14,uVar13);
            (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
                 dVar16 + (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities;
          }
        }
      }
      lVar12 = lVar12 + 1;
      iVar11 = scale->num_col;
      iVar10 = scale->num_row;
    } while (lVar12 < iVar10 + iVar11);
  }
  if (0 < iVar10) {
    dVar15 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
    uVar13 = SUB84(dVar15,0);
    uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
    dVar15 = (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities;
    piVar3 = (basis->basicIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (info->baseLower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (info->baseUpper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (info->baseValue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      iVar11 = piVar3[lVar12];
      if (iVar11 < scale->num_col) {
        dVar17 = pdVar4[iVar11];
      }
      else {
        dVar17 = 1.0 / pdVar5[iVar11 - scale->num_col];
      }
      dVar18 = pdVar6[lVar12] * dVar17;
      dVar16 = pdVar8[lVar12] * dVar17;
      if (dVar18 - dVar2 <= dVar16) {
        dVar17 = dVar17 * pdVar7[lVar12];
        if (dVar2 + dVar17 < dVar16) {
          dVar18 = dVar16 - dVar17;
          goto LAB_00362c63;
        }
      }
      else {
        dVar18 = dVar18 - dVar16;
LAB_00362c63:
        if (0.0 < dVar18) {
          pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
          *pHVar1 = *pHVar1 + 1;
          if ((double)CONCAT44(uVar14,uVar13) <= dVar18) {
            uVar13 = SUB84(dVar18,0);
            uVar14 = (undefined4)((ulong)dVar18 >> 0x20);
          }
          (highs_info->super_HighsInfoStruct).max_primal_infeasibility =
               (double)CONCAT44(uVar14,uVar13);
          dVar15 = dVar15 + dVar18;
          (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = dVar15;
          iVar10 = scale->num_row;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar10);
  }
  iVar11 = (highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
  if (iVar11 < 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  }
  else if (iVar11 == 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 1;
  }
  iVar11 = (highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
  if (iVar11 < 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  }
  else if (iVar11 == 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 1;
  }
  return;
}

Assistant:

void getUnscaledInfeasibilities(const HighsOptions& options,
                                const HighsScale& scale,
                                const SimplexBasis& basis,
                                const HighsSimplexInfo& info,
                                HighsInfo& highs_info) {
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  HighsInt& num_primal_infeasibilities = highs_info.num_primal_infeasibilities;
  double& max_primal_infeasibility = highs_info.max_primal_infeasibility;
  double& sum_primal_infeasibilities = highs_info.sum_primal_infeasibilities;
  HighsInt& num_dual_infeasibilities = highs_info.num_dual_infeasibilities;
  double& max_dual_infeasibility = highs_info.max_dual_infeasibility;
  double& sum_dual_infeasibilities = highs_info.sum_dual_infeasibilities;

  // Zero the counts of unscaled primal and dual infeasibilities
  num_primal_infeasibilities = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibilities = 0;
  num_dual_infeasibilities = 0;
  max_dual_infeasibility = 0;
  sum_dual_infeasibilities = 0;

  double scale_mu = 1.0;
  assert(int(scale.col.size()) == scale.num_col);
  assert(int(scale.row.size()) == scale.num_row);
  for (HighsInt iVar = 0; iVar < scale.num_col + scale.num_row; iVar++) {
    // Look at the dual infeasibilities of nonbasic variables
    if (basis.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
    // No dual infeasibility for fixed rows and columns
    if (info.workLower_[iVar] == info.workUpper_[iVar]) continue;
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      assert(int(scale.col.size()) > iCol);
      scale_mu = 1 / (scale.col[iCol] / scale.cost);
    } else {
      iRow = iVar - scale.num_col;
      assert(int(scale.row.size()) > iRow);
      scale_mu = scale.row[iRow] * scale.cost;
    }
    const double dual = info.workDual_[iVar];
    const double lower = info.workLower_[iVar];
    const double upper = info.workUpper_[iVar];
    const double unscaled_dual = dual * scale_mu;

    double dual_infeasibility;
    if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free: any nonzero dual value is infeasible
      dual_infeasibility = fabs(unscaled_dual);
    } else {
      // Not fixed: any dual infeasibility is given by value signed by
      // nonbasicMove. This assumes that nonbasicMove=0 for fixed
      // variables
      dual_infeasibility = -basis.nonbasicMove_[iVar] * unscaled_dual;
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= dual_feasibility_tolerance)
        num_dual_infeasibilities++;
      max_dual_infeasibility = max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibilities += dual_infeasibility;
    }
  }
  // Look at the primal infeasibilities of basic variables
  for (HighsInt ix = 0; ix < scale.num_row; ix++) {
    HighsInt iVar = basis.basicIndex_[ix];
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      scale_mu = scale.col[iCol];
    } else {
      iRow = iVar - scale.num_col;
      scale_mu = 1 / scale.row[iRow];
    }
    double unscaled_lower = info.baseLower_[ix] * scale_mu;
    double unscaled_value = info.baseValue_[ix] * scale_mu;
    double unscaled_upper = info.baseUpper_[ix] * scale_mu;
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (unscaled_value < unscaled_lower - primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_lower - unscaled_value;
    } else if (unscaled_value > unscaled_upper + primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_value - unscaled_upper;
    }
    if (primal_infeasibility > 0) {
      num_primal_infeasibilities++;
      max_primal_infeasibility =
          max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibilities += primal_infeasibility;
    }
  }
  setSolutionStatus(highs_info);
}